

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send2LMAT.c
# Opt level: O0

void send2LMAT(char *name,char *version,char *runid,char *message,int msgid,char *location,
              char *debug_dir)

{
  __pid_t _Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  long in_R9;
  long in_stack_00000008;
  gchar *host;
  gchar *pid;
  gchar *mid;
  gchar *rid;
  gchar *dbg;
  gchar *loc;
  gchar *msg;
  gchar *ver;
  gchar *nam;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  
  if (in_RDI == 0) {
    local_88 = g_strdup("NULL");
  }
  else {
    local_88 = g_strdup(in_RDI);
  }
  if (in_RSI == 0) {
    local_90 = g_strdup("NULL");
  }
  else {
    local_90 = g_strdup(in_RSI);
  }
  if (in_RCX == 0) {
    local_98 = g_strdup("NULL");
  }
  else {
    local_98 = g_strdup(in_RCX);
  }
  if (in_R9 == 0) {
    local_a0 = g_strdup("NULL");
  }
  else {
    local_a0 = g_strdup(in_R9);
  }
  if ((_s2dir == 0) || (in_stack_00000008 == 0)) {
    local_a8 = g_strdup("NULL");
  }
  else {
    local_a8 = g_strdup(in_stack_00000008);
  }
  if (in_RDX == 0) {
    local_b0 = g_strdup("NULL");
  }
  else {
    local_b0 = g_strdup(in_RDX);
  }
  uVar2 = g_strdup_printf("%d",in_R8D);
  _Var1 = getpid();
  uVar3 = g_strdup_printf("%ld",(long)_Var1);
  uVar4 = g_get_host_name();
  uVar4 = g_strdup(uVar4);
  fprintf(_stderr,"%s [PID %s RUNID %s] on %s:\n\t%s: %s\n[%s - %s]\n",local_88,uVar3,local_b0,uVar4
          ,uVar2,local_98,local_a0,local_90);
  g_free(uVar4);
  g_free(uVar3);
  g_free(uVar2);
  g_free(local_b0);
  g_free(local_a8);
  g_free(local_a0);
  g_free(local_98);
  g_free(local_90);
  g_free(local_88);
  return;
}

Assistant:

void send2LMAT(const char *name, const char *version, const char *runid,
               const char *message, int msgid, const char *location, const char *debug_dir) {
/*
    g_spawn_*'s argv arguments are of gchar ** type indicating that they may be
    modified by the called function
*/
    gchar *nam = name ? g_strdup(name) : g_strdup("NULL");
    gchar *ver = version ? g_strdup(version) : g_strdup("NULL");
    gchar *msg = message ? g_strdup(message) : g_strdup("NULL");
    gchar *loc = location ? g_strdup(location) : g_strdup("NULL");
    gchar *dbg G_GNUC_UNUSED = _s2dir && debug_dir ? g_strdup(debug_dir) : g_strdup("NULL");

    gchar *rid = runid ? g_strdup(runid) : g_strdup("NULL");
    gchar *mid = g_strdup_printf("%d", msgid);
    gchar *pid = g_strdup_printf("%ld", (long) getpid());

    gchar *host = g_strdup(g_get_host_name());

#ifndef STANDALONE
    if (!_s2err && p2sc_send2LMAT(nam, ver, rid, msg, mid, loc, dbg, pid, host)) ;
    else
#endif
        fprintf(stderr, "%s [PID %s RUNID %s] on %s:\n\t%s: %s\n[%s - %s]\n",
                nam, pid, rid, host, mid, msg, loc, ver);

    g_free(host);

    g_free(pid);
    g_free(mid);
    g_free(rid);

    g_free(dbg);
    g_free(loc);
    g_free(msg);
    g_free(ver);
    g_free(nam);
}